

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

void __thiscall
glslang::TParseContextBase::outputMessage
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,TPrefixType prefix,__va_list_tag *args)

{
  TInfoSinkBase *pTVar1;
  char local_508 [8];
  char szExtraInfo [1224];
  int maxSize;
  TPrefixType prefix_local;
  char *szExtraInfoFormat_local;
  char *szToken_local;
  char *szReason_local;
  TSourceLoc *loc_local;
  TParseContextBase *this_local;
  
  vsnprintf(local_508,0x4c8,szExtraInfoFormat,args);
  TInfoSinkBase::prefix(&((this->super_TParseVersions).infoSink)->info,prefix);
  TInfoSinkBase::location
            (&((this->super_TParseVersions).infoSink)->info,loc,
             ((this->super_TParseVersions).messages & EShMsgAbsolutePath) != EShMsgDefault,
             ((this->super_TParseVersions).messages & EShMsgDisplayErrorColumn) != EShMsgDefault);
  pTVar1 = TInfoSinkBase::operator<<(&((this->super_TParseVersions).infoSink)->info,"\'");
  pTVar1 = TInfoSinkBase::operator<<(pTVar1,szToken);
  pTVar1 = TInfoSinkBase::operator<<(pTVar1,"\' : ");
  pTVar1 = TInfoSinkBase::operator<<(pTVar1,szReason);
  pTVar1 = TInfoSinkBase::operator<<(pTVar1," ");
  pTVar1 = TInfoSinkBase::operator<<(pTVar1,local_508);
  TInfoSinkBase::operator<<(pTVar1,"\n");
  if (prefix == EPrefixError) {
    (this->super_TParseVersions).numErrors = (this->super_TParseVersions).numErrors + 1;
  }
  return;
}

Assistant:

void TParseContextBase::outputMessage(const TSourceLoc& loc, const char* szReason,
                                      const char* szToken,
                                      const char* szExtraInfoFormat,
                                      TPrefixType prefix, va_list args)
{
    const int maxSize = MaxTokenLength + 200;
    char szExtraInfo[maxSize];

    safe_vsprintf(szExtraInfo, maxSize, szExtraInfoFormat, args);

    infoSink.info.prefix(prefix);
    infoSink.info.location(loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
    infoSink.info << "'" << szToken <<  "' : " << szReason << " " << szExtraInfo << "\n";

    if (prefix == EPrefixError) {
        ++numErrors;
    }
}